

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

int FindCollisions<Blob<224>>
              (vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,
              HashSet<Blob<224>_> *collisions,int maxCollisions)

{
  pointer pBVar1;
  bool bVar2;
  int iVar3;
  size_t hnb;
  ulong uVar4;
  long lVar5;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  iVar3 = 0;
  lVar5 = 0x1c;
  for (uVar4 = 1;
      pBVar1 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x1c);
      uVar4 = uVar4 + 1) {
    bVar2 = Blob<224>::operator==
                      ((Blob<224> *)(pBVar1->bytes + lVar5),(Blob<224> *)(pBVar1[-1].bytes + lVar5))
    ;
    if (bVar2) {
      iVar3 = iVar3 + 1;
      if ((int)(collisions->super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>
               )._M_t._M_impl.super__Rb_tree_header._M_node_count < maxCollisions) {
        std::
        _Rb_tree<Blob<224>,Blob<224>,std::_Identity<Blob<224>>,std::less<Blob<224>>,std::allocator<Blob<224>>>
        ::_M_insert_unique<Blob<224>const&>
                  ((_Rb_tree<Blob<224>,Blob<224>,std::_Identity<Blob<224>>,std::less<Blob<224>>,std::allocator<Blob<224>>>
                    *)collisions,
                   (Blob<224> *)
                   (((hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
                     super__Vector_impl_data._M_start)->bytes + lVar5));
      }
    }
    lVar5 = lVar5 + 0x1c;
  }
  return iVar3;
}

Assistant:

int FindCollisions ( std::vector<hashtype> & hashes,
                     HashSet<hashtype> & collisions,
                     int maxCollisions )
{
  int collcount = 0;

  std::sort(hashes.begin(),hashes.end());

  for(size_t hnb = 1; hnb < hashes.size(); hnb++)
  {
    if(hashes[hnb] == hashes[hnb-1])
    {
      collcount++;
      //printHash(&hashes[hnb], sizeof(hashtype));

      if((int)collisions.size() < maxCollisions)
      {
        collisions.insert(hashes[hnb]);
      }
    }
  }

  return collcount;
}